

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::normalize_name
          (string *__return_storage_ptr__,t_netstd_generator *this,string *name,bool is_arg_name)

{
  __type _Var1;
  int iVar2;
  iterator iVar3;
  size_type sVar4;
  string tmp;
  key_type local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  for (sVar4 = 0; local_50._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    iVar2 = tolower((int)local_50._M_dataplus._M_p[sVar4]);
    local_50._M_dataplus._M_p[sVar4] = (char)iVar2;
  }
  if (is_arg_name) {
    _Var1 = std::operator==(&CANCELLATION_TOKEN_NAME_abi_cxx11_,name);
    if (_Var1) {
      std::__cxx11::string::append((char *)name);
    }
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->netstd_keywords)._M_t,&local_50);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::operator+(__return_storage_ptr__,"@",name);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::normalize_name(string name, bool is_arg_name)
{
    string tmp(name);
    transform(tmp.begin(), tmp.end(), tmp.begin(), static_cast<int(*)(int)>(tolower));

    // check for reserved argument names
    if( is_arg_name && (CANCELLATION_TOKEN_NAME == name))
	{
		name += "_";
	}

    // un-conflict keywords by prefixing with "@"
    if (netstd_keywords.find(tmp) != netstd_keywords.end())
    {
        return "@" + name;
    }
	
    // no changes necessary
    return name;
}